

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void draw_image(element_t *element,render_context_t *context,render_state_t *state,float x,float y,
               float width,float height)

{
  int iVar1;
  int iVar2;
  plutovg_surface_t *surface;
  undefined1 local_88 [8];
  plutovg_matrix_t matrix;
  float scale_y;
  float scale_x;
  view_position_t position;
  plutovg_rect_t src_rect;
  plutovg_rect_t dst_rect;
  float image_height;
  float image_width;
  plutovg_surface_t *image;
  float height_local;
  float width_local;
  float y_local;
  float x_local;
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  if ((state->mode != render_mode_bounding) &&
     (surface = load_image(element), surface != (plutovg_surface_t *)0x0)) {
    iVar1 = plutovg_surface_get_width(surface);
    iVar2 = plutovg_surface_get_height(surface);
    src_rect.y = (float)iVar2;
    position.align = view_align_none;
    position.scale = view_scale_meet;
    scale_y = 7.00649e-45;
    scale_x = 0.0;
    src_rect.x = (float)iVar1;
    src_rect.w = x;
    src_rect.h = y;
    parse_view_position(element,0x16,(view_position_t *)&scale_y);
    transform_view_rect((view_position_t *)&scale_y,(plutovg_rect_t *)&src_rect.w,
                        (plutovg_rect_t *)&position);
    local_88._0_4_ = width / src_rect.x;
    matrix.b = height / src_rect.y;
    local_88._4_4_ = 0.0;
    matrix.a = 0.0;
    matrix.c = -(float)position.align * (float)local_88._0_4_;
    matrix.d = -(float)position.scale * matrix.b;
    matrix.e = matrix.b;
    matrix.f = (float)local_88._0_4_;
    plutovg_canvas_set_fill_rule(context->canvas,PLUTOVG_FILL_RULE_NON_ZERO);
    plutovg_canvas_set_opacity(context->canvas,state->opacity);
    plutovg_canvas_set_matrix(context->canvas,&state->matrix);
    plutovg_canvas_translate(context->canvas,src_rect.w,src_rect.h);
    plutovg_canvas_set_texture
              (context->canvas,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,(plutovg_matrix_t *)local_88);
    plutovg_canvas_fill_rect(context->canvas,0.0,0.0,width,height);
    plutovg_surface_destroy(surface);
  }
  return;
}

Assistant:

static void draw_image(const element_t* element, const render_context_t* context, render_state_t* state, float x, float y, float width, float height)
{
    if(state->mode == render_mode_bounding)
        return;
    plutovg_surface_t* image = load_image(element);
    if(image == NULL)
        return;
    float image_width = plutovg_surface_get_width(image);
    float image_height = plutovg_surface_get_height(image);

    plutovg_rect_t dst_rect = {x, y, width, height};
    plutovg_rect_t src_rect = {0, 0, image_width, image_height};
    view_position_t position = {view_align_x_mid_y_mid, view_scale_meet};

    parse_view_position(element, ATTR_PRESERVE_ASPECT_RATIO, &position);
    transform_view_rect(&position, &dst_rect, &src_rect);

    float scale_x = dst_rect.w / src_rect.w;
    float scale_y = dst_rect.h / src_rect.h;
    plutovg_matrix_t matrix = {scale_x, 0, 0, scale_y, -src_rect.x * scale_x, -src_rect.y * scale_y};

    plutovg_canvas_set_fill_rule(context->canvas, PLUTOVG_FILL_RULE_NON_ZERO);
    plutovg_canvas_set_opacity(context->canvas, state->opacity);
    plutovg_canvas_set_matrix(context->canvas, &state->matrix);
    plutovg_canvas_translate(context->canvas, dst_rect.x, dst_rect.y);
    plutovg_canvas_set_texture(context->canvas, image, PLUTOVG_TEXTURE_TYPE_PLAIN, 1, &matrix);
    plutovg_canvas_fill_rect(context->canvas, 0, 0, dst_rect.w, dst_rect.h);
    plutovg_surface_destroy(image);
}